

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_5f851::MapDrivePlugIn::regenerateMap(MapDrivePlugIn *this)

{
  ulong *puVar1;
  uint uVar2;
  TerrainMap *pTVar3;
  _Bit_type *p_Var4;
  MapDriver *pMVar5;
  PolylineSegmentedPathwaySegmentRadii *this_00;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  size_type sVar14;
  ulong uVar15;
  ulong uVar16;
  size_type segmentIndex;
  GCRoute *in_RDX;
  GCRoute *pGVar17;
  GCRoute *extraout_RDX;
  GCRoute *extraout_RDX_00;
  GCRoute *extraout_RDX_01;
  GCRoute *pGVar18;
  GCRoute *pGVar19;
  long lVar20;
  ulong uVar21;
  size_type sVar22;
  int iVar23;
  float fVar24;
  undefined4 extraout_var;
  
  pTVar3 = this->vehicle->map;
  iVar23 = pTVar3->resolution;
  pGVar18 = (GCRoute *)(long)iVar23;
  if (0 < (long)pGVar18) {
    p_Var4 = (pTVar3->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    in_RDX = (GCRoute *)0x0;
    pGVar19 = pGVar18;
    pGVar17 = in_RDX;
    do {
      do {
        bVar6 = (byte)in_RDX & 0x3f;
        puVar1 = p_Var4 + ((ulong)in_RDX >> 6);
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        in_RDX = (GCRoute *)
                 ((long)&(in_RDX->super_SegmentedPathway).super_Pathway._vptr_Pathway +
                 (long)pGVar18);
        pGVar19 = (GCRoute *)
                  ((long)&pGVar19[-1].segmentRadii_.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7);
      } while (pGVar19 != (GCRoute *)0x0);
      in_RDX = (GCRoute *)((long)&(pGVar17->super_SegmentedPathway).super_Pathway._vptr_Pathway + 1)
      ;
      pGVar19 = pGVar18;
      pGVar17 = in_RDX;
    } while (in_RDX != pGVar18);
  }
  if (this->useRandomRocks == true) {
    iVar7 = rand();
    iVar7 = (int)((float)iVar7 * 4.656613e-10 * 100.0 + 50.0);
    in_RDX = extraout_RDX;
    if (0 < iVar7) {
      fVar24 = (float)(iVar23 + -4);
      iVar23 = 0;
      do {
        iVar8 = rand();
        iVar9 = rand();
        iVar10 = rand();
        iVar10 = (int)((float)iVar10 * 4.656613e-10 * 10.0 + 0.0);
        in_RDX = extraout_RDX_00;
        if (0 < iVar10) {
          do {
            iVar11 = rand();
            iVar12 = rand();
            iVar11 = (int)((float)iVar11 * 4.656613e-10 * 4.0 + 0.0) +
                     (int)((float)iVar8 * 4.656613e-10 * fVar24 + 0.0) +
                     ((int)((float)iVar12 * 4.656613e-10 * 4.0 + 0.0) +
                     (int)((float)iVar9 * 4.656613e-10 * fVar24 + 0.0)) * pTVar3->resolution;
            uVar15 = (ulong)iVar11;
            uVar13 = uVar15 + 0x3f;
            if (-1 < (long)uVar15) {
              uVar13 = uVar15;
            }
            in_RDX = (GCRoute *)(1L << ((byte)iVar11 & 0x3f));
            puVar1 = (pTVar3->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     ((long)uVar13 >> 6) +
                     (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) +
                     0xffffffffffffffff;
            *puVar1 = *puVar1 | (ulong)in_RDX;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 != iVar7);
    }
  }
  pMVar5 = this->vehicle;
  pTVar3 = pMVar5->map;
  uVar2 = pTVar3->resolution;
  iVar23 = (int)(uVar2 - ((int)uVar2 >> 4)) >> 1;
  iVar7 = (int)(((int)uVar2 >> 4) + uVar2) >> 1;
  if (iVar23 <= iVar7) {
    p_Var4 = (pTVar3->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar20 = (long)iVar23;
    iVar7 = iVar7 + 1;
    iVar23 = iVar7 - iVar23;
    uVar15 = ((long)(int)uVar2 + 1) * lVar20;
    iVar8 = iVar23;
    uVar13 = uVar15;
    do {
      do {
        uVar21 = uVar15 + 0x3f;
        if (-1 < (long)uVar15) {
          uVar21 = uVar15;
        }
        bVar6 = (byte)uVar15 & 0x3f;
        in_RDX = (GCRoute *)(p_Var4 + ((long)uVar21 >> 6));
        puVar1 = (ulong *)((long)in_RDX +
                          (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8);
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        uVar15 = uVar15 + (long)(int)uVar2;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      lVar20 = lVar20 + 1;
      uVar15 = uVar13 + 1;
      iVar8 = iVar23;
      uVar13 = uVar15;
    } while (iVar7 != (int)lVar20);
  }
  iVar23 = (anonymous_namespace)::MapDriver::demoSelect;
  if (0 < (int)uVar2 && (anonymous_namespace)::MapDriver::demoSelect < 2) {
    uVar15 = (ulong)uVar2;
    uVar13 = (ulong)(uVar2 - 1);
    uVar21 = 0;
    do {
      p_Var4 = (pTVar3->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar16 = uVar21;
      pGVar18 = (GCRoute *)0x0;
      do {
        in_RDX = pGVar18;
        pGVar18 = (GCRoute *)
                  ((long)&in_RDX[-1].segmentRadii_.super__Vector_base<float,_std::allocator<float>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        if (((((uVar21 == 0) || (in_RDX == (GCRoute *)0x0)) || (uVar21 == uVar13)) ||
            (-(long)in_RDX == uVar13)) ||
           ((((uVar2 >> 4) + uVar2 >> 1 < uVar21 ||
             (long)uVar21 < (long)((int)(uVar2 - (uVar2 >> 4)) >> 1)) &&
             ((long)uVar21 < (long)(int)(uVar2 - (uVar2 >> 3)) && uVar2 >> 3 < uVar21) &&
            (((long)&(in_RDX->super_SegmentedPathway).super_Pathway._vptr_Pathway + uVar21 == 0 ||
             ((GCRoute *)(uVar21 - uVar13) == in_RDX)))))) {
          in_RDX = (GCRoute *)(uVar16 >> 6);
          puVar1 = p_Var4 + (long)in_RDX;
          *puVar1 = *puVar1 | 1L << ((byte)uVar16 & 0x3f);
        }
        uVar16 = uVar16 + uVar15;
      } while (-(long)pGVar18 != uVar15);
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar15);
  }
  if (iVar23 == 2) {
    iVar23 = (*(pMVar5->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
    sVar14 = CONCAT44(extraout_var,iVar23);
    segmentIndex = 0;
    sVar22 = sVar14 - 1;
    if (this->vehicle->pathFollowDirection < 1) {
      sVar22 = segmentIndex;
      segmentIndex = sVar14 - 1;
    }
    fVar24 = OpenSteer::PolylineSegmentedPathwaySegmentRadii::segmentRadius
                       (this->vehicle->path,sVar22);
    if (sVar14 != 0) {
      sVar22 = 0;
      do {
        this_00 = this->vehicle->path;
        iVar23 = rand();
        OpenSteer::PolylineSegmentedPathwaySegmentRadii::setSegmentRadius
                  (this_00,sVar22,(float)iVar23 * 4.656613e-10 * 15.0 + 4.0);
        sVar22 = sVar22 + 1;
      } while (sVar14 != sVar22);
    }
    OpenSteer::PolylineSegmentedPathwaySegmentRadii::setSegmentRadius
              (this->vehicle->path,segmentIndex,fVar24);
    in_RDX = extraout_RDX_01;
  }
  if ((this->usePathFences == true) && ((anonymous_namespace)::MapDriver::demoSelect == 2)) {
    drawPathFencesOnMap((MapDrivePlugIn *)this->vehicle->map,(TerrainMap *)this->vehicle->path,
                        in_RDX);
    return;
  }
  return;
}

Assistant:

void regenerateMap (void)
	{
	    // regenerate map: clear and add random "rocks"
	    vehicle->map->clear();
	    drawRandomClumpsOfRocksOnMap (*vehicle->map);
	    clearCenterOfMap (*vehicle->map);

	    // draw fences for first two demo modes
	    if (vehicle->demoSelect < 2) drawBoundaryFencesOnMap (*vehicle->map);

	    // randomize path widths
	    if (vehicle->demoSelect == 2)
	    {
		const OpenSteer::size_t count = vehicle->path->segmentCount();
		const bool upstream = vehicle->pathFollowDirection > 0;
		const OpenSteer::size_t entryIndex = upstream ? 0 : count-1;
		const OpenSteer::size_t exitIndex  = upstream ? count-1 : 0;
		const float lastExitRadius = vehicle->path->segmentRadius( exitIndex );
		for (OpenSteer::size_t i = 0; i < count; i++)
		{
		    vehicle->path->setSegmentRadius( i, frandom2 (4, 19) );
		}
		vehicle->path->setSegmentRadius( entryIndex, lastExitRadius );
	    }

	    // mark path-boundary map cells as obstacles
	    // (when in path following demo and appropriate mode is set)
	    if (usePathFences && (vehicle->demoSelect == 2))
		drawPathFencesOnMap (*vehicle->map, *vehicle->path);
	}